

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

string * __thiscall
CLI::Formatter::make_subcommand_abi_cxx11_(string *__return_storage_ptr__,Formatter *this,App *sub)

{
  pointer pcVar1;
  stringstream out;
  string local_1f0;
  string local_1d0;
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  ::std::__cxx11::stringstream::stringstream(local_1b0);
  pcVar1 = (sub->name_)._M_dataplus._M_p;
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d0,pcVar1,pcVar1 + (sub->name_)._M_string_length);
  pcVar1 = (sub->description_)._M_dataplus._M_p;
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f0,pcVar1,pcVar1 + (sub->description_)._M_string_length);
  detail::format_help(local_1a0,&local_1d0,&local_1f0,(this->super_FormatterBase).column_width_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b0);
  ::std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

inline std::string Formatter::make_subcommand(const App *sub) const {
    std::stringstream out;
    detail::format_help(out, sub->get_name(), sub->get_description(), column_width_);
    return out.str();
}